

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

TValue * ffi_clib_index(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  long lVar2;
  TValue *pTVar3;
  long in_RDI;
  CLibrary *cl;
  TValue *o;
  GCstr *in_stack_00000028;
  CLibrary *in_stack_00000030;
  lua_State *in_stack_00000038;
  undefined8 in_stack_ffffffffffffffe8;
  
  L_00 = *(lua_State **)(in_RDI + 0x10);
  if (((L_00 < *(lua_State **)(in_RDI + 0x18)) &&
      (iVar1._0_1_ = L_00->marked, iVar1._1_1_ = L_00->gct, iVar1._2_1_ = L_00->dummy_ffid,
      iVar1._3_1_ = L_00->status, iVar1 == -0xd)) &&
     (*(char *)((ulong)(L_00->nextgc).gcptr32 + 6) == '\x02')) {
    lVar2 = (ulong)(L_00->nextgc).gcptr32 + 0x18;
    if ((&L_00->glref < *(undefined1 **)(in_RDI + 0x18)) && ((L_00->gclist).gcptr32 == 0xfffffffb))
    {
      pTVar3 = lj_clib_index(in_stack_00000038,in_stack_00000030,in_stack_00000028);
      return pTVar3;
    }
    lj_err_argt(L_00,(int)((ulong)lVar2 >> 0x20),(int)lVar2);
  }
  lj_err_argt(L_00,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(int)in_stack_ffffffffffffffe8);
}

Assistant:

static TValue *ffi_clib_index(lua_State *L)
{
  TValue *o = L->base;
  CLibrary *cl;
  if (!(o < L->top && tvisudata(o) && udataV(o)->udtype == UDTYPE_FFI_CLIB))
    lj_err_argt(L, 1, LUA_TUSERDATA);
  cl = (CLibrary *)uddata(udataV(o));
  if (!(o+1 < L->top && tvisstr(o+1)))
    lj_err_argt(L, 2, LUA_TSTRING);
  return lj_clib_index(L, cl, strV(o+1));
}